

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.hpp
# Opt level: O0

void __thiscall
vk::BinaryRegistryDetail::ProgramIdentifierIndex::ProgramIdentifierIndex
          (ProgramIdentifierIndex *this,ProgramIdentifier *id_,deUint32 index_)

{
  deUint32 index__local;
  ProgramIdentifier *id__local;
  ProgramIdentifierIndex *this_local;
  
  ProgramIdentifier::ProgramIdentifier(&this->id,id_);
  this->index = index_;
  return;
}

Assistant:

ProgramIdentifierIndex (const ProgramIdentifier&	id_,
							deUint32					index_)
		: id	(id_)
		, index	(index_)
	{}